

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_base.cpp
# Opt level: O3

uint64_t r_exec::ModelBase::MEntry::_ComputeHashCode(_Fact *component)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 *puVar6;
  uint64_t uVar7;
  short sVar8;
  Atom head;
  undefined4 local_1c;
  long *plVar5;
  
  bVar1 = _Fact::is_fact(component);
  iVar3 = (*(component->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(component,0);
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  puVar6 = (undefined4 *)(**(code **)(*plVar5 + 0x20))(plVar5,0);
  local_1c = *puVar6;
  uVar4 = r_code::Atom::asOpcode();
  cVar2 = r_code::Atom::getDescriptor();
  uVar7 = (ulong)!bVar1 * 0x2000;
  if (cVar2 == -0x3d) {
    sVar8 = (short)uVar4;
    if (sVar8 == Opcodes::Cmd) {
      (**(code **)(*plVar5 + 0x20))(plVar5,1);
      uVar4 = r_code::Atom::asOpcode();
      uVar7 = uVar7 + (uVar4 & 0x3ff) + 0x800;
    }
    else if (sVar8 == Opcodes::IMdl) {
      uVar4 = (**(code **)(*plVar5 + 0x48))(plVar5,0);
      uVar7 = uVar7 + (uVar4 & 0x3ff) + 0xc00;
    }
    else if (sVar8 == Opcodes::ICst) {
      uVar4 = (**(code **)(*plVar5 + 0x48))(plVar5,0);
      uVar7 = uVar7 + (uVar4 & 0x3ff) + 0x1000;
    }
    else {
      uVar7 = uVar7 | uVar4 & 0x3ff;
    }
  }
  else if (cVar2 == -0x3c) {
    uVar7 = uVar7 + (uVar4 & 0x3ff) + 0x400;
  }
  r_code::Atom::~Atom((Atom *)&local_1c);
  return uVar7;
}

Assistant:

uint64_t ModelBase::MEntry::_ComputeHashCode(_Fact *component)   // 14 bits: [fact or |fact (1)|type (3)|data (10)].
{
    uint64_t hash_code;

    if (component->is_fact()) {
        hash_code = 0x00000000;
    } else {
        hash_code = 0x00002000;
    }

    Code *payload = component->get_reference(0);
    Atom head = payload->code(0);
    uint16_t opcode = head.asOpcode();

    switch (head.getDescriptor()) {
    case Atom::OBJECT:
        if (opcode == Opcodes::Cmd) { // type: 2.
            hash_code |= 0x00000800;
            hash_code |= (payload->code(CMD_FUNCTION).asOpcode() & 0x000003FF); // data: function id.
        } else if (opcode == Opcodes::IMdl) { // type 3.
            hash_code |= 0x00000C00;
            hash_code |= (((uintptr_t)payload->get_reference(0)) & 0x000003FF); // data: address of the mdl.
        } else if (opcode == Opcodes::ICst) { // type 4.
            hash_code |= 0x00001000;
            hash_code |= (((uintptr_t)payload->get_reference(0)) & 0x000003FF); // data: address of the cst.
        } else { // type: 0.
            hash_code |= (opcode & 0x000003FF);    // data: class id.
        }

        break;

    case Atom::MARKER: // type 1.
        hash_code |= 0x00000400;
        hash_code |= (opcode & 0x000003FF); // data: class id.
        break;
    }

    return hash_code;
}